

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpw.cpp
# Opt level: O0

int getPW(char *pin,char *newPIN,CK_ULONG userType)

{
  int iVar1;
  size_t sVar2;
  long in_RDX;
  void *in_RSI;
  char *in_RDI;
  int length;
  size_t size;
  char password2 [256];
  char password1 [256];
  int local_234;
  char local_228 [256];
  char local_128 [160];
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  
  local_234 = 0;
  if (in_RDI != (char *)0x0) {
    sVar2 = strlen(in_RDI);
    local_234 = (int)sVar2;
    if ((3 < local_234) && (local_234 < 0x100)) {
      memcpy(local_128,in_RDI,(long)(local_234 + 1));
    }
  }
  while( true ) {
    if (3 < local_234 && local_234 < 0x100) {
      memcpy(in_RSI,local_128,(long)(local_234 + 1));
      return 0;
    }
    if (in_RDX == 0) {
      printf("=== SO PIN (%i-%i characters) ===\n",4,0xff);
      local_234 = getpin(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff78);
    }
    else {
      printf("=== User PIN (%i-%i characters) ===\n",4,0xff);
      local_234 = getpin(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff78);
    }
    if (local_234 < 0) break;
    if ((local_234 < 4) || (0xff < local_234)) {
      fprintf(_stderr,"ERROR: The length of the PIN is out of range.\n");
      local_234 = 0;
    }
    else {
      if (in_RDX == 0) {
        local_234 = getpin(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78);
      }
      else {
        local_234 = getpin(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78);
      }
      if (local_234 < 0) {
        return 1;
      }
      iVar1 = strcmp(local_128,local_228);
      if (iVar1 != 0) {
        fprintf(_stderr,"ERROR: The entered PINs are not equal.\n");
        local_234 = 0;
      }
    }
  }
  return 1;
}

Assistant:

int getPW(char* pin, char* newPIN, CK_ULONG userType)
{
	char password1[MAX_PIN_LEN+1];
	char password2[MAX_PIN_LEN+1];
	size_t size = MAX_PIN_LEN+1;
	int length = 0;

	// Check if the user has provided a password
	if (pin)
	{
		length = strlen(pin);
		// Save the PIN if it has the correct length
		if (length >= MIN_PIN_LEN && length <= MAX_PIN_LEN)
			memcpy(password1, pin, length+1);
	}

	while (length < MIN_PIN_LEN || length > MAX_PIN_LEN)
	{
		if (userType == CKU_SO)
		{
			printf("=== SO PIN (%i-%i characters) ===\n",
				MIN_PIN_LEN, MAX_PIN_LEN);
			length = getpin("Please enter SO PIN: ",
					password1, size);
		}
		else
		{
			printf("=== User PIN (%i-%i characters) ===\n",
				MIN_PIN_LEN, MAX_PIN_LEN);
			length = getpin("Please enter user PIN: ",
					password1, size);
		}

		if (length < 0)
			return 1;
		if (length < MIN_PIN_LEN || length > MAX_PIN_LEN)
		{
			fprintf(stderr, "ERROR: The length of the PIN is out of range.\n");
			length = 0;
			continue;
		}

		if (userType == CKU_SO)
		{
			length = getpin("Please reenter SO PIN: ",
					password2, size);
		}
		else
		{
			length = getpin("Please reenter user PIN: ",
					password2, size);
		}

		if (length < 0)
			return 1;
		if (strcmp(password1, password2))
		{
			fprintf(stderr, "ERROR: The entered PINs are not equal.\n");
			length = 0;
			continue;
		}
	}

	memcpy(newPIN, password1, length+1);
	return 0;
}